

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_diff.hpp
# Opt level: O3

Diffs * __thiscall
MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
diff_bisect(Diffs *__return_storage_ptr__,
           MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,Range text1,Range text2,Time deadline)

{
  pointer *ppDVar1;
  long lVar2;
  iterator __position;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  ConstIter CVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  int iVar19;
  long lVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  ConstIter CVar24;
  ConstIter CVar25;
  ulong uVar26;
  ulong uVar27;
  int iVar28;
  long lVar29;
  int local_11c;
  Diff local_a0;
  vector<int,_std::allocator<int>_> v2;
  vector<int,_std::allocator<int>_> v1;
  
  CVar25 = text2.till._M_current;
  CVar24 = text2.from._M_current;
  CVar15 = text1.from._M_current;
  uVar27 = (long)text1.till._M_current._M_current - (long)CVar15._M_current;
  uVar18 = (long)CVar25._M_current - (long)CVar24._M_current;
  iVar3 = (int)uVar27;
  iVar4 = (int)uVar18;
  iVar28 = iVar3 + iVar4 + 1;
  uVar5 = ((iVar3 + iVar4) - (iVar28 >> 0x1f)) + 1;
  uVar6 = uVar5 & 0xfffffffe;
  v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize(&v1,(long)(int)uVar6);
  v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize(&v2,(long)(int)uVar6);
  uVar5 = (int)uVar5 >> 1;
  uVar8 = (ulong)uVar5;
  if (1 < iVar28) {
    uVar16 = 1;
    if (1 < (int)uVar6) {
      uVar16 = (ulong)uVar6;
    }
    uVar22 = 0;
    do {
      v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [uVar22] = -1;
      v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [uVar22] = -1;
      uVar22 = uVar22 + 1;
    } while (uVar16 != uVar22);
  }
  iVar21 = 0;
  v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
  [(long)(int)uVar5 + 1] = 0;
  v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
  [(long)(int)uVar5 + 1] = 0;
  if (1 < iVar28) {
    uVar9 = iVar3 - iVar4;
    uVar16 = 0;
    iVar28 = 0;
    local_11c = 0;
    iVar11 = 0;
    iVar19 = 0;
    do {
      iVar7 = (int)uVar16;
      if (iVar28 - iVar7 <= iVar7 - local_11c) {
        iVar10 = iVar7 - iVar28;
        uVar22 = (ulong)(iVar28 + iVar21);
        do {
          lVar2 = uVar22 + uVar8;
          if (uVar22 == -uVar16) {
            uVar12 = (ulong)(uint)v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start[lVar2 + 1];
          }
          else if ((uVar22 == uVar16) ||
                  (uVar12 = (ulong)(uint)v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start[lVar2 + 1],
                  v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[lVar2 + 1] <=
                  v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[lVar2 + -1])) {
            uVar12 = (ulong)(v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar2 + -1] + 1);
          }
          iVar13 = (int)uVar12;
          uVar14 = iVar13 - (int)uVar22;
          uVar26 = (ulong)uVar14;
          if ((iVar13 < iVar3) && ((int)uVar14 < iVar4)) {
            uVar12 = (ulong)iVar13;
            uVar26 = (ulong)(iVar13 + iVar10);
            while( true ) {
              if ((uVar27 <= uVar12) || (uVar18 <= uVar26)) goto LAB_001025a2;
              if (CVar15._M_current[uVar12] != CVar24._M_current[uVar26]) break;
              uVar12 = uVar12 + 1;
              uVar26 = uVar26 + 1;
              if (((long)iVar3 <= (long)uVar12) || ((long)iVar4 <= (long)uVar26)) break;
            }
          }
          iVar13 = (int)uVar12;
          v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [lVar2] = iVar13;
          if (iVar3 < iVar13) {
            local_11c = local_11c + 2;
          }
          else if (iVar4 < (int)uVar26) {
            iVar28 = iVar28 + 2;
          }
          else if (((((uVar9 & 1) != 0) && (uVar14 = (uVar9 + uVar5) - (int)uVar22, uVar14 < uVar6))
                   && (v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar14] != -1)) &&
                  (iVar3 - v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar14] <= iVar13)) {
            diff_bisectSplit(__return_storage_ptr__,this,text1,text2,iVar13,(int)uVar26,deadline);
            goto LAB_00102563;
          }
          uVar22 = uVar22 + 2;
          iVar10 = iVar10 + -2;
        } while ((long)uVar22 <= (long)(uVar16 - (long)local_11c));
      }
      if (iVar11 - iVar7 <= iVar7 - iVar19) {
        iVar7 = iVar7 - iVar11;
        uVar22 = (ulong)(iVar21 + iVar11);
        do {
          lVar2 = uVar22 + uVar8;
          if (uVar22 == -uVar16) {
            iVar10 = v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar2 + 1];
          }
          else if ((uVar22 == uVar16) ||
                  (iVar10 = v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar2 + 1],
                  iVar10 <= v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar2 + -1])) {
            iVar10 = v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar2 + -1] + 1;
          }
          iVar13 = iVar10 - (int)uVar22;
          if ((iVar10 < iVar3) && (iVar13 < iVar4)) {
            lVar17 = (long)(iVar10 + iVar7);
            lVar29 = (long)iVar10;
            lVar20 = (ulong)((~(uint)text1.from._M_current + (int)text1.till._M_current) - iVar10)
                     << 0x20;
            lVar23 = (ulong)((~(uint)text2.from._M_current + (int)text2.till._M_current) -
                            (iVar10 + iVar7)) << 0x20;
            do {
              if ((uVar27 <= (ulong)(lVar20 >> 0x20)) || (uVar18 <= (ulong)(lVar23 >> 0x20))) {
LAB_001025a2:
                __assert_fail("idx < size()",
                              "/workspace/llm4binary/github/license_c_cmakelists/gritzko[P]myers-diff/dmp_diff.hpp"
                              ,0x76,
                              "Char MyersDiff<std::basic_string<char>>::Range::operator[](Size) const [String = std::basic_string<char>]"
                             );
              }
              if (CVar15._M_current[lVar20 >> 0x20] != CVar24._M_current[lVar23 >> 0x20]) break;
              lVar29 = lVar29 + 1;
              lVar17 = lVar17 + 1;
              if (iVar3 <= lVar29) break;
              lVar20 = lVar20 + -0x100000000;
              lVar23 = lVar23 + -0x100000000;
            } while (lVar17 < iVar4);
            iVar13 = (int)lVar17;
            iVar10 = (int)lVar29;
          }
          v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [lVar2] = iVar10;
          if (iVar3 < iVar10) {
            iVar19 = iVar19 + 2;
          }
          else if (iVar4 < iVar13) {
            iVar11 = iVar11 + 2;
          }
          else if (((((uVar9 & 1) == 0) && (uVar14 = (uVar9 + uVar5) - (int)uVar22, uVar14 < uVar6))
                   && (iVar13 = v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar14], iVar13 != -1)) &&
                  (iVar3 - iVar10 <= iVar13)) {
            diff_bisectSplit(__return_storage_ptr__,this,text1,text2,iVar13,
                             (uVar5 - uVar14) + iVar13,deadline);
            goto LAB_00102563;
          }
          uVar22 = uVar22 + 2;
          iVar7 = iVar7 + -2;
        } while ((long)uVar22 <= (long)(uVar16 - (long)iVar19));
      }
      uVar16 = uVar16 + 1;
      iVar21 = iVar21 + -1;
    } while (uVar16 != uVar8);
  }
  (__return_storage_ptr__->
  super__Vector_base<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a0.operation = DELETE;
  local_a0.text.from._M_current = CVar15._M_current;
  local_a0.text.till._M_current = text1.till._M_current._M_current;
  std::
  vector<MyersDiff<std::__cxx11::string>::Diff,std::allocator<MyersDiff<std::__cxx11::string>::Diff>>
  ::_M_realloc_insert<MyersDiff<std::__cxx11::string>::Diff>
            ((vector<MyersDiff<std::__cxx11::string>::Diff,std::allocator<MyersDiff<std::__cxx11::string>::Diff>>
              *)__return_storage_ptr__,(iterator)0x0,&local_a0);
  __position._M_current =
       (__return_storage_ptr__->
       super__Vector_base<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_a0.operation = INSERT;
  local_a0.text.from._M_current = CVar24._M_current;
  local_a0.text.till._M_current = CVar25._M_current;
  if (__position._M_current ==
      (__return_storage_ptr__->
      super__Vector_base<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<MyersDiff<std::__cxx11::string>::Diff,std::allocator<MyersDiff<std::__cxx11::string>::Diff>>
    ::_M_realloc_insert<MyersDiff<std::__cxx11::string>::Diff>
              ((vector<MyersDiff<std::__cxx11::string>::Diff,std::allocator<MyersDiff<std::__cxx11::string>::Diff>>
                *)__return_storage_ptr__,__position,&local_a0);
  }
  else {
    ((__position._M_current)->text).till._M_current = CVar25._M_current;
    *(ulong *)__position._M_current = CONCAT71(local_a0._1_7_,1);
    ((__position._M_current)->text).from._M_current = CVar24._M_current;
    ppDVar1 = &(__return_storage_ptr__->
               super__Vector_base<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    *ppDVar1 = *ppDVar1 + 1;
  }
LAB_00102563:
  if (v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                    ._M_start);
  }
  if (v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                    ._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Diffs diff_bisect(Range text1, Range text2, Time deadline) {
        // Cache the text lengths to prevent multiple calls.
        int text1_length = text1.size();
        int text2_length = text2.size();
        int max_d = (text1_length + text2_length + 1) / 2;
        int v_offset = max_d;
        int v_length = 2 * max_d;
        vector<int> v1;
        v1.resize(v_length);
        vector<int> v2;
        v2.resize(v_length);
        for (int x = 0; x < v_length; x++) {
            v1[x] = -1;
            v2[x] = -1;
        }
        v1[v_offset + 1] = 0;
        v2[v_offset + 1] = 0;
        int delta = text1_length - text2_length;
        // If the total number of characters is odd, then the front path will
        // collide with the reverse path.
        bool front = (delta % 2 != 0);
        // Offsets for start and end of k loop.
        // Prevents mapping of space beyond the grid.
        int k1start = 0;
        int k1end = 0;
        int k2start = 0;
        int k2end = 0;
        for (int d = 0; d < max_d; d++) {
            // Bail out if deadline is reached.
            /* TODO if (System.currentTimeMillis() > deadline) {
              break;
            } */

            // Walk the front path one step.
            for (int k1 = -d + k1start; k1 <= d - k1end; k1 += 2) {
                int k1_offset = v_offset + k1;
                int x1;
                if (k1 == -d ||
                    (k1 != d && v1[k1_offset - 1] < v1[k1_offset + 1])) {
                    x1 = v1[k1_offset + 1];
                } else {
                    x1 = v1[k1_offset - 1] + 1;
                }
                int y1 = x1 - k1;
                while (x1 < text1_length && y1 < text2_length &&
                       text1[x1] == text2[y1]) {
                    x1++;
                    y1++;
                }
                v1[k1_offset] = x1;
                if (x1 > text1_length) {
                    // Ran off the right of the graph.
                    k1end += 2;
                } else if (y1 > text2_length) {
                    // Ran off the bottom of the graph.
                    k1start += 2;
                } else if (front) {
                    int k2_offset = v_offset + delta - k1;
                    if (k2_offset >= 0 && k2_offset < v_length &&
                        v2[k2_offset] != -1) {
                        // Mirror x2 onto top-left coordinate system.
                        int x2 = text1_length - v2[k2_offset];
                        if (x1 >= x2) {
                            // Overlap detected.
                            return diff_bisectSplit(text1, text2, x1, y1,
                                                    deadline);
                        }
                    }
                }
            }

            // Walk the reverse path one step.
            for (int k2 = -d + k2start; k2 <= d - k2end; k2 += 2) {
                int k2_offset = v_offset + k2;
                int x2;
                if (k2 == -d ||
                    (k2 != d && v2[k2_offset - 1] < v2[k2_offset + 1])) {
                    x2 = v2[k2_offset + 1];
                } else {
                    x2 = v2[k2_offset - 1] + 1;
                }
                int y2 = x2 - k2;
                while (x2 < text1_length && y2 < text2_length &&
                       text1[text1_length - x2 - 1] ==
                           text2[text2_length - y2 - 1]) {
                    x2++;
                    y2++;
                }
                v2[k2_offset] = x2;
                if (x2 > text1_length) {
                    // Ran off the left of the graph.
                    k2end += 2;
                } else if (y2 > text2_length) {
                    // Ran off the top of the graph.
                    k2start += 2;
                } else if (!front) {
                    int k1_offset = v_offset + delta - k2;
                    if (k1_offset >= 0 && k1_offset < v_length &&
                        v1[k1_offset] != -1) {
                        int x1 = v1[k1_offset];
                        int y1 = v_offset + x1 - k1_offset;
                        // Mirror x2 onto top-left coordinate system.
                        x2 = text1_length - x2;
                        if (x1 >= x2) {
                            // Overlap detected.
                            return diff_bisectSplit(text1, text2, x1, y1,
                                                    deadline);
                        }
                    }
                }
            }
        }
        // Diff took too long and hit the deadline or
        // number of diffs equals number of characters, no commonality at all.
        Diffs diffs{};
        diffs.push_back(Diff{DELETE, text1});
        diffs.push_back(Diff{INSERT, text2});
        return diffs;
    }